

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_result.hpp
# Opt level: O1

const_string __thiscall boost::test_tools::assertion_result::message(assertion_result *this)

{
  long lVar1;
  long lVar2;
  element_type *peVar3;
  iterator in_RDX;
  iterator extraout_RDX;
  iterator extraout_RDX_00;
  long in_RSI;
  const_string cVar4;
  long *local_38 [2];
  long local_28 [2];
  
  lVar1 = *(long *)(in_RSI + 8);
  if (lVar1 == 0) {
    peVar3 = (element_type *)&unit_test::basic_cstring<char_const>::null_str()::null;
    *(undefined1 **)this = &unit_test::basic_cstring<char_const>::null_str()::null;
  }
  else {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)(lVar1 + 0x178),(string *)local_38);
    in_RDX = extraout_RDX;
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
      in_RDX = extraout_RDX_00;
    }
    lVar2 = *(long *)(lVar1 + 0x178);
    *(long *)this = lVar2;
    peVar3 = (element_type *)(lVar2 + *(long *)(lVar1 + 0x180));
  }
  (this->m_message).px = peVar3;
  cVar4.m_end = in_RDX;
  cVar4.m_begin = (iterator)this;
  return cVar4;
}

Assistant:

const_string        message() const                   { return !m_message ? const_string() : const_string( m_message->str() ); }